

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_free(wally_tx *tx,_Bool free_parent)

{
  ulong local_20;
  size_t i;
  _Bool free_parent_local;
  wally_tx *tx_local;
  
  if (tx != (wally_tx *)0x0) {
    for (local_20 = 0; local_20 < tx->num_inputs; local_20 = local_20 + 1) {
      tx_input_free(tx->inputs + local_20,false);
    }
    clear_and_free(tx->inputs,tx->inputs_allocation_len * 0xd0);
    for (local_20 = 0; local_20 < tx->num_outputs; local_20 = local_20 + 1) {
      tx_output_free(tx->outputs + local_20,false);
    }
    clear_and_free(tx->outputs,tx->outputs_allocation_len * 0x70);
    wally_clear(tx,0x38);
    if (free_parent) {
      wally_free(tx);
    }
  }
  return 0;
}

Assistant:

static int tx_free(struct wally_tx *tx, bool free_parent)
{
    size_t i;
    if (tx) {
        for (i = 0; i < tx->num_inputs; ++i)
            tx_input_free(&tx->inputs[i], false);
        clear_and_free(tx->inputs, tx->inputs_allocation_len * sizeof(*tx->inputs));
        for (i = 0; i < tx->num_outputs; ++i)
            tx_output_free(&tx->outputs[i], false);
        clear_and_free(tx->outputs, tx->outputs_allocation_len * sizeof(*tx->outputs));
        wally_clear(tx, sizeof(*tx));
        if (free_parent)
            wally_free(tx);
    }
    return WALLY_OK;
}